

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqapi.cpp
# Opt level: O0

SQRESULT sq_getclosurename(HSQUIRRELVM v,SQInteger idx)

{
  SQObjectPtr *pSVar1;
  SQObjectPtr *o;
  SQInteger idx_local;
  HSQUIRRELVM v_local;
  
  pSVar1 = stack_get(v,idx);
  if (((pSVar1->super_SQObject)._type == OT_NATIVECLOSURE) ||
     ((pSVar1->super_SQObject)._type == OT_CLOSURE)) {
    if ((pSVar1->super_SQObject)._type == OT_NATIVECLOSURE) {
      SQVM::Push(v,&((pSVar1->super_SQObject)._unVal.pNativeClosure)->_name);
    }
    else {
      SQVM::Push(v,&((pSVar1->super_SQObject)._unVal.pClosure)->_function->_name);
    }
    v_local = (HSQUIRRELVM)0x0;
  }
  else {
    v_local = (HSQUIRRELVM)sq_throwerror(v,"the target is not a closure");
  }
  return (SQRESULT)v_local;
}

Assistant:

SQRESULT sq_getclosurename(HSQUIRRELVM v,SQInteger idx)
{
    SQObjectPtr &o = stack_get(v,idx);
    if(!sq_isnativeclosure(o) &&
        !sq_isclosure(o))
        return sq_throwerror(v,_SC("the target is not a closure"));
    if(sq_isnativeclosure(o))
    {
        v->Push(_nativeclosure(o)->_name);
    }
    else { //closure
        v->Push(_closure(o)->_function->_name);
    }
    return SQ_OK;
}